

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O3

string * __thiscall
(anonymous_namespace)::DestinationEncoder::operator()[abi_cxx11_
          (string *__return_storage_ptr__,void *this,WitnessUnknown *id)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  byte *pbVar7;
  long in_FS_OFFSET;
  initializer_list<unsigned_char> __l;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  allocator_type local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  byte local_39;
  string *local_38;
  
  local_38 = *(string **)(in_FS_OFFSET + 0x28);
  if ((id->m_version - 0x11 < 0xfffffff0) ||
     ((id->m_program).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish +
      (-0x29 - (long)(id->m_program).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) < (pointer)0xffffffffffffffd9)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_39 = (byte)id->m_version;
    __l._M_len = 1;
    __l._M_array = &local_39;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_58,__l,&local_59);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&local_58,
               (((long)(id->m_program).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(id->m_program).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start) * 8 + 4U) / 5 + 1);
    pbVar7 = (id->m_program).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (id->m_program).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pbVar7 != pbVar2) {
      uVar3 = 0;
      uVar4 = 0;
      do {
        bVar1 = *pbVar7;
        uVar3 = (ulong)(((uint)uVar3 & 0xf) << 8) | (ulong)bVar1;
        uVar6 = uVar4 + 8;
        lVar5 = uVar4 + 3;
        do {
          local_39 = (byte)(uVar3 >> ((byte)lVar5 & 0x3f)) & 0x1f;
          if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,
                       (iterator)
                       local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_39);
          }
          else {
            *local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = local_39;
            local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar6 = uVar6 - 5;
          lVar5 = lVar5 + -5;
        } while (4 < uVar6);
        pbVar7 = pbVar7 + 1;
        uVar4 = uVar6;
      } while (pbVar7 != pbVar2);
      if (uVar6 != 0) {
        local_39 = bVar1 << (-(char)lVar5 & 0x3fU) & 0x1f;
        if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,
                     (iterator)
                     local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_39);
        }
        else {
          *local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish = local_39;
          local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
    }
    bech32::Encode(__return_storage_ptr__,BECH32M,(string *)(*this + 0x220),&local_58);
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (*(string **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(string **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

std::string operator()(const WitnessUnknown& id) const
    {
        const std::vector<unsigned char>& program = id.GetWitnessProgram();
        if (id.GetWitnessVersion() < 1 || id.GetWitnessVersion() > 16 || program.size() < 2 || program.size() > 40) {
            return {};
        }
        std::vector<unsigned char> data = {(unsigned char)id.GetWitnessVersion()};
        data.reserve(1 + (program.size() * 8 + 4) / 5);
        ConvertBits<8, 5, true>([&](unsigned char c) { data.push_back(c); }, program.begin(), program.end());
        return bech32::Encode(bech32::Encoding::BECH32M, m_params.Bech32HRP(), data);
    }